

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Mat LongDynXdot(double t,Mat *x,Mat *u)

{
  double *extraout_RDX;
  Mat MVar1;
  Mat local_50;
  Mat local_40;
  undefined1 local_29;
  Mat *u_local;
  Mat *x_local;
  double t_local;
  Mat *xdot;
  
  local_29 = 0;
  u_local = u;
  x_local = (Mat *)t;
  t_local = (double)x;
  operator*(&local_40,&A_long);
  operator*(&local_50,&B_long);
  operator+(x,&local_40);
  Mat::~Mat(&local_50);
  Mat::~Mat(&local_40);
  MVar1.v_ = extraout_RDX;
  MVar1._0_8_ = x;
  return MVar1;
}

Assistant:

Mat LongDynXdot(const double t, Mat x, Mat u)
{	
    Mat xdot = A_long * x + B_long * u;
    return xdot;	
}